

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

CharacterNode * __thiscall
icu_63::TextTrieMap::addChildNode
          (TextTrieMap *this,CharacterNode *parent,UChar c,UErrorCode *status)

{
  UBool UVar1;
  CharacterNode *pCVar2;
  CharacterNode *node;
  int32_t parentIndex;
  UChar childCharacter;
  CharacterNode *current;
  uint16_t nodeIndex;
  uint16_t prevIndex;
  UErrorCode *status_local;
  CharacterNode *pCStack_20;
  UChar c_local;
  CharacterNode *parent_local;
  TextTrieMap *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    current._6_2_ = 0;
    current._4_2_ = parent->fFirstChild;
    while (current._4_2_ != 0) {
      pCVar2 = this->fNodes + (int)(uint)current._4_2_;
      if (pCVar2->fCharacter == c) {
        return pCVar2;
      }
      if ((ushort)c < (ushort)pCVar2->fCharacter) break;
      current._6_2_ = current._4_2_;
      current._4_2_ = pCVar2->fNextSibling;
    }
    pCStack_20 = parent;
    if (this->fNodesCount == this->fNodesCapacity) {
      pCVar2 = this->fNodes;
      UVar1 = growNodes(this);
      if (UVar1 == '\0') {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return (CharacterNode *)0x0;
      }
      pCStack_20 = this->fNodes + (int)((long)parent - (long)pCVar2 >> 4);
    }
    this_local = (TextTrieMap *)(this->fNodes + this->fNodesCount);
    CharacterNode::clear((CharacterNode *)this_local);
    *(UChar *)&this_local->fIgnoreCase = c;
    *(uint16_t *)&this_local->field_0xc = current._4_2_;
    if (current._6_2_ == 0) {
      pCStack_20->fFirstChild = (uint16_t)this->fNodesCount;
    }
    else {
      this->fNodes[current._6_2_].fNextSibling = (uint16_t)this->fNodesCount;
    }
    this->fNodesCount = this->fNodesCount + 1;
  }
  else {
    this_local = (TextTrieMap *)0x0;
  }
  return (CharacterNode *)this_local;
}

Assistant:

CharacterNode*
TextTrieMap::addChildNode(CharacterNode *parent, UChar c, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    // Linear search of the sorted list of children.
    uint16_t prevIndex = 0;
    uint16_t nodeIndex = parent->fFirstChild;
    while (nodeIndex > 0) {
        CharacterNode *current = fNodes + nodeIndex;
        UChar childCharacter = current->fCharacter;
        if (childCharacter == c) {
            return current;
        } else if (childCharacter > c) {
            break;
        }
        prevIndex = nodeIndex;
        nodeIndex = current->fNextSibling;
    }

    // Ensure capacity. Grow fNodes[] if needed.
    if (fNodesCount == fNodesCapacity) {
        int32_t parentIndex = (int32_t)(parent - fNodes);
        if (!growNodes()) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        parent = fNodes + parentIndex;
    }

    // Insert a new child node with c in sorted order.
    CharacterNode *node = fNodes + fNodesCount;
    node->clear();
    node->fCharacter = c;
    node->fNextSibling = nodeIndex;
    if (prevIndex == 0) {
        parent->fFirstChild = (uint16_t)fNodesCount;
    } else {
        fNodes[prevIndex].fNextSibling = (uint16_t)fNodesCount;
    }
    ++fNodesCount;
    return node;
}